

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retire_cid.c
# Opt level: O0

void quicly_retire_cid_push(quicly_retire_cid_set_t *set,uint64_t sequence)

{
  size_t i;
  uint64_t sequence_local;
  quicly_retire_cid_set_t *set_local;
  
  if (set->_num_pending != 8) {
    for (i = 0; i < set->_num_pending; i = i + 1) {
      if (set->sequences[i] == sequence) {
        return;
      }
    }
    set->sequences[set->_num_pending] = sequence;
    set->_num_pending = set->_num_pending + 1;
  }
  return;
}

Assistant:

void quicly_retire_cid_push(quicly_retire_cid_set_t *set, uint64_t sequence)
{
    if (set->_num_pending == PTLS_ELEMENTSOF(set->sequences)) {
        /* in case we don't find an empty slot, we'll just drop this sequence (never send RETIRE_CONNECTION_ID frame) */
        return;
    }

    for (size_t i = 0; i < set->_num_pending; i++) {
        if (set->sequences[i] == sequence) {
            /* already scheduled */
            return;
        }
    }

    set->sequences[set->_num_pending] = sequence;
    set->_num_pending++;
}